

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void clean_up(void)

{
  free_staticCache(&cacheset.A.local);
  free_staticCache(&cacheset.AAAA.local);
  free_staticCache(&cacheset.blacklist);
  free_cache(&cacheset.A.temp);
  free_cache(&cacheset.AAAA.temp);
  return;
}

Assistant:

void clean_up(){
  #ifdef _WIN64
    shutdown(query_sockfd,2);
    shutdown(server_sockfd,2);
    closesocket(query_sockfd);
    closesocket(server_sockfd);
    WSACleanup();
  #elif __linux
  #endif
  free_staticCache(&cacheset.A.local);
  free_staticCache(&cacheset.AAAA.local);
  free_staticCache(&cacheset.blacklist);  
  free_cache(&cacheset.A.temp);
  free_cache(&cacheset.AAAA.temp);
  
}